

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O3

void __thiscall draco::Mesh::SetFace(Mesh *this,FaceIndex face_id,Face *face)

{
  pointer paVar1;
  unsigned_long __i0;
  long lVar2;
  value_type local_28;
  
  paVar1 = (this->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((uint)((int)((ulong)((long)(this->faces_).vector_.
                                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) >> 2) *
            -0x55555555) <= face_id.value_) {
    local_28._M_elems[2].value_ = 0;
    local_28._M_elems[0].value_ = 0;
    local_28._M_elems[1].value_ = 0;
    std::
    vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
    ::resize(&(this->faces_).vector_,(ulong)(face_id.value_ + 1),&local_28);
    paVar1 = (this->faces_).vector_.
             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  lVar2 = 0;
  do {
    paVar1[face_id.value_]._M_elems[lVar2].value_ = face->_M_elems[lVar2].value_;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void SetFace(FaceIndex face_id, const Face &face) {
    if (face_id >= static_cast<uint32_t>(faces_.size())) {
      faces_.resize(face_id.value() + 1, Face());
    }
    faces_[face_id] = face;
  }